

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

bool __thiscall ON_FixedSizePool::InPool(ON_FixedSizePool *this,void *p)

{
  char *ptr;
  char *next_block;
  char *block_end;
  char *block;
  void *p_local;
  ON_FixedSizePool *this_local;
  
  if (p != (void *)0x0) {
    block_end = (char *)this->m_first_block;
    while (block_end != (char *)0x0) {
      if (block_end == (char *)this->m_al_block) {
        ptr = (char *)0x0;
        next_block = (char *)this->m_al_element_array;
      }
      else {
        ptr = *(char **)block_end;
        next_block = *(char **)(block_end + 8);
      }
      block_end = block_end + 0x10;
      if ((block_end <= p) && (p < next_block)) {
        return true;
      }
      block_end = ptr;
    }
  }
  return false;
}

Assistant:

bool ON_FixedSizePool::InPool(
  const void* p
) const
{
  if (nullptr != p)
  {
    const char* block;
    const char* block_end;
    const char* next_block;
    const char* ptr = (const char*)p;
    for (block = (const char*)m_first_block; 0 != block; block = next_block)
    {
      if (block == m_al_block)
      {
        // After a ReturnAll(), a multi-block fsp has unused blocks after m_al_block.
        // Searching must terminate at m_al_block.
        next_block = nullptr;
        block_end = (const char*)m_al_element_array;
        block += (2 * sizeof(void*));
      }
      else
      {
        next_block = *((const char**)block);
        block += sizeof(void*);
        block_end = *((const char**)(block));
        block += sizeof(void*);
      }
      if (ptr >= block && ptr < block_end)
        return true;
    }
  }

  return false;
}